

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

SchemaResolution __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::furtherResolution(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                    *this,Node *reader)

{
  Type TVar1;
  int iVar2;
  SchemaResolution SVar3;
  undefined4 extraout_var;
  type pNVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Node *in_RSI;
  long *in_RDI;
  SchemaResolution thisMatch;
  NodePtr *node_1;
  size_t i;
  NodePtr *node;
  SchemaResolution match;
  ulong local_28;
  SchemaResolution local_14;
  
  local_14 = RESOLVE_NO_MATCH;
  TVar1 = Node::type(in_RSI);
  if (TVar1 == AVRO_NUM_TYPES) {
    iVar2 = (*in_RSI->_vptr_Node[5])(in_RSI,0);
    pNVar4 = boost::shared_ptr<avro::Node>::operator*
                       ((shared_ptr<avro::Node> *)CONCAT44(extraout_var,iVar2));
    local_14 = (**(code **)(*in_RDI + 0x60))(in_RDI,pNVar4);
  }
  else {
    TVar1 = Node::type(in_RSI);
    if (TVar1 == AVRO_UNION) {
      for (local_28 = 0; iVar2 = (*in_RSI->_vptr_Node[4])(),
          local_28 < CONCAT44(extraout_var_00,iVar2); local_28 = local_28 + 1) {
        iVar2 = (*in_RSI->_vptr_Node[5])(in_RSI,local_28 & 0xffffffff);
        pNVar4 = boost::shared_ptr<avro::Node>::operator*
                           ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_01,iVar2));
        SVar3 = (**(code **)(*in_RDI + 0x60))(in_RDI,pNVar4);
        if (SVar3 == RESOLVE_MATCH) {
          return RESOLVE_MATCH;
        }
        if (local_14 == RESOLVE_NO_MATCH) {
          local_14 = SVar3;
        }
      }
    }
  }
  return local_14;
}

Assistant:

SchemaResolution furtherResolution(const Node &reader) const {
        SchemaResolution match = RESOLVE_NO_MATCH;

        if (reader.type() == AVRO_SYMBOLIC) {
    
            // resolve the symbolic type, and check again
            const NodePtr &node = reader.leafAt(0);
            match = resolve(*node);
        }
        else if(reader.type() == AVRO_UNION) {

            // in this case, need to see if there is an exact match for the
            // writer's type, or if not, the first one that can be promoted to a
            // match
        
            for(size_t i= 0; i < reader.leaves(); ++i)  {

                const NodePtr &node = reader.leafAt(i);
                SchemaResolution thisMatch = resolve(*node);

                // if matched then the search is done
                if(thisMatch == RESOLVE_MATCH) {
                    match = thisMatch;
                    break;
                }

                // thisMatch is either no match, or promotable, this will set match to 
                // promotable if it hasn't been set already
                if (match == RESOLVE_NO_MATCH) {
                    match = thisMatch;
                }
            }
        }

        return match;
    }